

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O3

int __thiscall
FileHandlePool::getAvailableResource
          (FileHandlePool *this,fdb_file_handle **dbfile,fdb_kvs_handle **db)

{
  int iVar1;
  PoolEntry *pPVar2;
  PoolEntry *pPVar3;
  pointer ppPVar4;
  bool bVar5;
  
  iVar1 = rand();
  ppPVar4 = (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (PoolEntry *)
           ((long)(this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4 >> 3);
  pPVar3 = (PoolEntry *)(long)(int)((ulong)(long)iVar1 % (ulong)pPVar2);
  if (pPVar3 < pPVar2) {
    do {
      pPVar2 = ppPVar4[(long)pPVar3];
      if (pPVar2 != (PoolEntry *)0x0) {
        LOCK();
        bVar5 = (pPVar2->available)._M_base._M_i == true;
        if (bVar5) {
          (pPVar2->available)._M_base._M_i = false;
        }
        UNLOCK();
        if (bVar5) goto LAB_0010744c;
      }
      iVar1 = rand();
      ppPVar4 = (this->pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (PoolEntry *)
               ((long)(this->pool_vector).
                      super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppPVar4 >> 3);
      pPVar3 = (PoolEntry *)(long)(int)((ulong)(long)iVar1 % (ulong)pPVar2);
    } while (pPVar3 < pPVar2);
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pPVar3,
             pPVar2);
LAB_0010744c:
  *dbfile = pPVar2->dbfile;
  *db = pPVar2->db;
  return pPVar2->index;
}

Assistant:

int getAvailableResource(fdb_file_handle **dbfile, fdb_kvs_handle **db) {
        while (true) {
            int index = rand() % pool_vector.size();
            bool inverse = true;
            PoolEntry *pe = pool_vector.at(index);
            if (pe && pe->available.compare_exchange_strong(inverse, false)) {
                *dbfile = pe->dbfile;
                *db = pe->db;
                return pe->index;
            }
        }
    }